

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void aiAttachLogStream(aiLogStream *stream)

{
  _func_int **pp_Var1;
  bool bVar2;
  mapped_type pLVar3;
  mapped_type *ppLVar4;
  Logger *pLVar5;
  
  pLVar3 = (mapped_type)Assimp::Intern::AllocateFromAssimpHeap::operator_new(0x18);
  pLVar3->_vptr_LogStream = (_func_int **)&PTR__LogToCallbackRedirector_008ebce0;
  pp_Var1 = (_func_int **)stream->user;
  pLVar3[1]._vptr_LogStream = (_func_int **)stream->callback;
  pLVar3[2]._vptr_LogStream = pp_Var1;
  if (stream->callback != (aiLogStreamCallback)0x0) {
    ppLVar4 = std::
              map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
              ::operator[]((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                            *)Assimp::gActiveLogStreams,stream);
    *ppLVar4 = pLVar3;
    bVar2 = Assimp::DefaultLogger::isNullLogger();
    if (bVar2) {
      Assimp::DefaultLogger::create
                ((char *)0x0,(uint)(Assimp::gVerboseLogging == 1),9,(IOSystem *)0x0);
    }
    pLVar5 = Assimp::DefaultLogger::get();
    (*pLVar5->_vptr_Logger[2])(pLVar5,pLVar3,0xf);
    return;
  }
  __assert_fail("__null != s.callback",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x75,"LogToCallbackRedirector::LogToCallbackRedirector(const aiLogStream &)");
}

Assistant:

ASSIMP_API void aiAttachLogStream( const aiLogStream* stream )
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif

    LogStream* lg = new LogToCallbackRedirector(*stream);
    gActiveLogStreams[*stream] = lg;

    if (DefaultLogger::isNullLogger()) {
        DefaultLogger::create(NULL,(gVerboseLogging == AI_TRUE ? Logger::VERBOSE : Logger::NORMAL));
    }
    DefaultLogger::get()->attachStream(lg);
    ASSIMP_END_EXCEPTION_REGION(void);
}